

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

void AddTail<stCoCondItem_t,stCoCond_t>(stCoCond_t *apLink,stCoCondItem_t *ap)

{
  stCoCondItem_t *psVar1;
  stCoCond_t *psVar2;
  
  if (ap->pLink != (stCoCond_t *)0x0) {
    return;
  }
  psVar1 = apLink->tail;
  psVar2 = (stCoCond_t *)&psVar1->pNext;
  if (psVar1 == (stCoCondItem_t *)0x0) {
    psVar2 = apLink;
  }
  psVar2->head = ap;
  apLink->tail = ap;
  ap->pPrev = psVar1;
  ap->pNext = (stCoCondItem_t *)0x0;
  ap->pLink = apLink;
  return;
}

Assistant:

void inline AddTail(TLink*apLink,TNode *ap)
{
	if( ap->pLink )
	{
		return ;
	}
	if(apLink->tail)
	{
		apLink->tail->pNext = (TNode*)ap;
		ap->pNext = NULL;
		ap->pPrev = apLink->tail;
		apLink->tail = ap;
	}
	else
	{
		apLink->head = apLink->tail = ap;
		ap->pNext = ap->pPrev = NULL;
	}
	ap->pLink = apLink;
}